

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scenario.cpp
# Opt level: O3

void __thiscall
multi_agent_planning::Scenario::Scenario
          (Scenario *this,
          vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
          *actions,vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                   *graphs,int numInteractions)

{
  vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  *this_00;
  pointer *pppVar1;
  int max;
  pointer peVar2;
  iterator __position;
  pointer ppVar3;
  int *piVar4;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
  *paVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  undefined8 uVar8;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
  *paVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  pointer pvVar14;
  iterator iVar15;
  vector<multi_agent_planning::Interaction,std::allocator<multi_agent_planning::Interaction>>
  *this_01;
  int iVar16;
  pointer pvVar17;
  long lVar18;
  ulong uVar19;
  Interaction *pIVar20;
  iterator __position_00;
  ulong uVar21;
  pointer peVar22;
  byte bVar23;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  generated;
  Graph g;
  Interaction local_118;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_d0;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
  local_a0;
  undefined4 uStack_68;
  undefined4 local_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  property_type *local_54;
  int iStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  property_type *local_38;
  
  bVar23 = 0;
  std::
  vector<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
  ::vector(&this->interactionMaps,
           ((long)(actions->
                  super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(actions->
                  super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)&local_118);
  this_00 = &this->allActions;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar14 = (actions->
            super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar17 = (actions->
            super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar17 != pvVar14) {
    uVar21 = 0;
    do {
      peVar22 = pvVar14[uVar21].
                super__Vector_base<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar2 = pvVar14[uVar21].
               super__Vector_base<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (peVar22 != peVar2) {
        do {
          local_118.agentA = (int)uVar21;
          local_118.actionA.m_eproperty = peVar22->m_eproperty;
          uVar6 = (peVar22->super_edge_base<boost::directed_tag,_unsigned_long>).m_source;
          uVar7 = (peVar22->super_edge_base<boost::directed_tag,_unsigned_long>).m_target;
          local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ =
               (undefined4)uVar6;
          local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ =
               (undefined4)(uVar6 >> 0x20);
          local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ =
               (undefined4)uVar7;
          local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ =
               (undefined4)(uVar7 >> 0x20);
          __position._M_current =
               (this->allActions).
               super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->allActions).
              super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>
            ::
            _M_realloc_insert<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>
                      ((vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>
                        *)this_00,__position,
                       (pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>
                        *)&local_118);
          }
          else {
            ((__position._M_current)->second).super_edge_base<boost::directed_tag,_unsigned_long>.
            m_target = uVar7;
            ((__position._M_current)->second).m_eproperty = local_118.actionA.m_eproperty;
            *(ulong *)__position._M_current = CONCAT44(local_118._4_4_,local_118.agentA);
            ((__position._M_current)->second).super_edge_base<boost::directed_tag,_unsigned_long>.
            m_source = uVar6;
            pppVar1 = &(this->allActions).
                       super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          peVar22 = peVar22 + 1;
        } while (peVar22 != peVar2);
        pvVar14 = (actions->
                  super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pvVar17 = (actions->
                  super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar21 = uVar21 + 1;
      uVar19 = ((long)pvVar17 - (long)pvVar14 >> 3) * -0x5555555555555555;
    } while (uVar21 <= uVar19 && uVar19 - uVar21 != 0);
  }
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar16 = 0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < numInteractions) {
    do {
      do {
        do {
          iVar11 = getRndInt((int)((ulong)((long)(this->allActions).
                                                 super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->allActions).
                                                super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                             -1);
          iVar12 = getRndInt((int)((ulong)((long)(this->allActions).
                                                 super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->allActions).
                                                super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                             -1);
          ppVar3 = (this_00->
                   super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (ppVar3[iVar11].first == ppVar3[iVar12].first);
        local_118.agentA = iVar11;
        local_118._4_4_ = iVar12;
        iVar15 = std::
                 _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 ::find(&local_d0,(key_type *)&local_118);
      } while ((_Rb_tree_header *)iVar15._M_node != &local_d0._M_impl.super__Rb_tree_header);
      local_118.agentA = iVar11;
      local_118._4_4_ = iVar12;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)&local_d0,(pair<int,_int> *)&local_118);
      ppVar3 = (this_00->
               super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar4 = (int *)ppVar3[iVar12].second.m_eproperty;
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
      ::adjacency_list(&local_a0,
                       (graphs->
                       super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + ppVar3[iVar12].first);
      max = *piVar4;
      do {
        iVar13 = getRndInt(-max,max);
      } while (iVar13 == 0);
      ppVar3 = (this->allActions).
               super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_118.agentA = ppVar3[iVar11].first;
      local_118.agentB = ppVar3[iVar12].first;
      local_118.actionA.m_eproperty = ppVar3[iVar11].second.m_eproperty;
      uVar8 = ppVar3[iVar11].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
      uVar6 = ppVar3[iVar11].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
      local_48 = (undefined4)uVar8;
      uStack_44 = (undefined4)((ulong)uVar8 >> 0x20);
      uStack_40 = (undefined4)uVar6;
      uStack_3c = (undefined4)(uVar6 >> 0x20);
      local_118.actionB.m_eproperty = ppVar3[iVar12].second.m_eproperty;
      uVar8 = ppVar3[iVar12].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
      uVar6 = ppVar3[iVar12].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
      local_64 = (undefined4)uVar8;
      uStack_60 = (undefined4)((ulong)uVar8 >> 0x20);
      uStack_5c = (undefined4)uVar6;
      uStack_58 = (undefined4)(uVar6 >> 0x20);
      local_118._4_4_ = iStack_4c;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ =
           local_48;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ =
           uStack_44;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ =
           uStack_40;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ =
           local_64;
      local_118._36_4_ = uStack_68;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ =
           uStack_60;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ =
           uStack_5c;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ =
           uStack_3c;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ =
           uStack_58;
      local_118.cost = iVar13;
      local_54 = local_118.actionB.m_eproperty;
      local_38 = local_118.actionA.m_eproperty;
      this_01 = (vector<multi_agent_planning::Interaction,std::allocator<multi_agent_planning::Interaction>>
                 *)std::
                   map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>
                   ::operator[]((this->interactionMaps).
                                super__Vector_base<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_118.agentA,
                                &local_118.actionA);
      __position_00._M_current = *(Interaction **)(this_01 + 8);
      if (__position_00._M_current == *(Interaction **)(this_01 + 0x10)) {
        std::
        vector<multi_agent_planning::Interaction,std::allocator<multi_agent_planning::Interaction>>
        ::_M_realloc_insert<multi_agent_planning::Interaction_const&>
                  (this_01,__position_00,&local_118);
      }
      else {
        pIVar20 = &local_118;
        for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
          uVar10 = *(undefined4 *)&pIVar20->field_0x4;
          (__position_00._M_current)->agentA = pIVar20->agentA;
          *(undefined4 *)&(__position_00._M_current)->field_0x4 = uVar10;
          pIVar20 = (Interaction *)((long)pIVar20 + ((ulong)bVar23 * -2 + 1) * 8);
          __position_00._M_current = __position_00._M_current + (ulong)bVar23 * -0x10 + 8;
        }
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x48;
      }
      operator_delete(local_a0.m_property.px);
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::~vector(&local_a0.super_type.m_vertices);
      paVar9 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                *)local_a0.super_type.m_edges.
                  super__List_base<boost::list_edge<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::list_edge<unsigned_long,_multi_agent_planning::Action>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
      while (paVar9 != &local_a0) {
        paVar5 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                  *)(paVar9->super_type).m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::list_edge<unsigned_long,_multi_agent_planning::Action>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
        operator_delete(paVar9);
        paVar9 = paVar5;
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 != numInteractions);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_d0);
  return;
}

Assistant:

Scenario::Scenario(const std::vector<std::vector<Edge> >& actions, 
									 const std::vector<Graph>& graphs, int numInteractions) : 
		interactionMaps(actions.size()), allActions() {

	for (int i = 0; i < actions.size(); ++i) {
		transform(actions[i].begin(), actions[i].end(), 
							back_inserter(allActions), 
							[i](const Edge& e){return make_pair(i, e);});
	}

	set<pair<int, int> > generated;

	for (int i = 0; i < numInteractions; ++i) {

		int actA, actB;
		
		do {
			actA = getRndInt(allActions.size()-1);
			actB = getRndInt(allActions.size()-1);
		} while ((allActions[actA].first == allActions[actB].first) || 
					  (generated.find(make_pair(actA, actB)) != generated.end()));

		generated.insert(make_pair(actA, actB));
 
 		std::pair<int, Edge> action = allActions[actB];

 		Graph g = graphs[action.first];
 		int cost = g[action.second].cost;

 		int interactionCost;
 		do {
 			interactionCost = getRndInt(-cost, cost);
 		} while (interactionCost == 0);

		Interaction interaction(allActions[actA], allActions[actB], interactionCost);
		insertInteraction(interaction);
	}

}